

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O1

int main(void)

{
  wtree_node **ppwVar1;
  byte *pbVar2;
  int iVar3;
  wtree_node *pwVar4;
  long *plVar5;
  wtree_node *pwVar6;
  bool bVar7;
  void *__ptr;
  int iVar8;
  int iVar9;
  anon_struct_16_2_62e9fd8f *pathp__1;
  ulong uVar10;
  ulong *puVar11;
  wtree_node_t *pwVar12;
  ulong *puVar13;
  long lVar14;
  wtree_node_t *pwVar15;
  wtree_node_t *pwVar16;
  uint uVar17;
  anon_struct_16_2_62e9fd8f *pathp_;
  ulong *puVar18;
  char *__function;
  int iVar19;
  wtree_node_t *tnode;
  ulong *puVar20;
  undefined1 auVar21 [8];
  wtree_node_t *pwVar22;
  ulong uVar23;
  anon_struct_16_2_62e9fd8f *pathp__3;
  int *piVar24;
  char *__assertion;
  anon_struct_16_2_62e9fd8f *pathp__2;
  undefined8 *puVar25;
  wtree_node *pwVar26;
  wtree_node *pwVar27;
  wtree_node *pwVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 local_9f8 [8];
  wtree_walk walk;
  wtree_node_t *local_1f0;
  wtree_node_t *left_1;
  uint local_70;
  wtree_node_t *local_68;
  wtree_node_t *right;
  wtree_node_t *local_58;
  wtree_node_t *left;
  int local_44;
  void *local_40;
  wtree_node_t *local_38;
  
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  uVar10 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar10 & 0xffffffff);
  fputc(10,_stdout);
  pwVar15 = (wtree_node_t *)0x0;
  srand((uint)uVar10);
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","check_aug");
  local_40 = calloc(3000,8);
  iVar8 = 0;
  pwVar16 = (wtree_node_t *)0x0;
  do {
    iVar19 = (int)pwVar15;
    local_38 = (wtree_node_t *)CONCAT44(local_38._4_4_,iVar8);
    if ((0 < iVar19) && (iVar8 = rand(), iVar8 % 100 < 0x14)) {
      iVar8 = rand();
      pwVar12 = *(wtree_node_t **)((long)local_40 + (long)(iVar8 % iVar19) * 8);
      pwVar15 = (wtree_node_t *)(ulong)(iVar19 - 1);
      *(undefined8 *)((long)local_40 + (long)(iVar8 % iVar19) * 8) =
           *(undefined8 *)((long)local_40 + (long)pwVar15 * 8);
      *(undefined8 *)((long)local_40 + (long)pwVar15 * 8) = 0;
      local_9f8 = (undefined1  [8])pwVar16;
      puVar13 = (ulong *)local_9f8;
      if (pwVar16 == (wtree_node_t *)0x0) {
        puVar18 = (ulong *)0x0;
      }
      else {
        iVar8 = pwVar12->value;
        puVar18 = (ulong *)0x0;
        pwVar22 = pwVar16;
        do {
          iVar19 = pwVar22->value;
          uVar17 = (uint)(iVar19 < iVar8);
          if (iVar8 < iVar19) {
            uVar17 = 0xffffffff;
          }
          bVar32 = pwVar22 < pwVar12;
          uVar30 = (uint)bVar32;
          if (!bVar32 && pwVar22 != pwVar12) {
            uVar30 = 0xffffffff;
          }
          if (uVar17 != 0) {
            uVar30 = uVar17;
          }
          *(uint *)(puVar13 + 1) = uVar30;
          bVar7 = iVar8 < iVar19;
          if (uVar17 == 0) {
            bVar7 = !bVar32 && pwVar22 != pwVar12;
          }
          puVar11 = puVar13;
          if (bVar7) {
            puVar13[2] = (ulong)(pwVar22->in_tree).rbn_left;
            bVar32 = true;
          }
          else {
            puVar25 = (undefined8 *)((ulong)(pwVar22->in_tree).rbn_right_red & 0xfffffffffffffffe);
            puVar13[2] = (ulong)puVar25;
            bVar32 = true;
            if (uVar30 == 0) {
              *(undefined4 *)(puVar13 + 1) = 1;
              puVar18 = puVar13;
              while (puVar11 = puVar18 + 2, puVar25 != (undefined8 *)0x0) {
                *(undefined4 *)(puVar18 + 3) = 0xffffffff;
                puVar25 = (undefined8 *)*puVar25;
                puVar18[4] = (ulong)puVar25;
                puVar18 = puVar11;
              }
              bVar32 = false;
              puVar18 = puVar13;
            }
          }
          puVar13 = puVar11;
          if (!bVar32) break;
          pwVar22 = (wtree_node_t *)puVar11[2];
          puVar13 = puVar11 + 2;
        } while (pwVar22 != (wtree_node_t *)0x0);
      }
      if ((wtree_node_t *)*puVar18 != pwVar12) {
        __assertion = "nodep->node == node";
        goto LAB_00102806;
      }
      puVar11 = puVar13 + -2;
      pwVar22 = (wtree_node_t *)puVar13[-2];
      auVar21 = (undefined1  [8])pwVar16;
      if (pwVar22 == pwVar12) {
        auVar21 = (undefined1  [8])(pwVar12->in_tree).rbn_left;
        if (auVar21 == (undefined1  [8])0x0) {
          auVar21 = (undefined1  [8])pwVar16;
          if (puVar11 != (ulong *)local_9f8) goto LAB_00101719;
          auVar21 = (undefined1  [8])(wtree_node_t *)0x0;
        }
        else {
          if (((ulong)(pwVar12->in_tree).rbn_right_red & 1) != 0) {
            __assertion = "rbtn_red_get(wtree_node_t, in_tree, node) == false";
            goto LAB_00102806;
          }
          pwVar28 = (((wtree_node_t *)auVar21)->in_tree).rbn_right_red;
          if (((ulong)pwVar28 & 1) == 0) {
            __assertion = "rbtn_red_get(wtree_node_t, in_tree, left)";
            goto LAB_00102806;
          }
          (((wtree_node_t *)auVar21)->in_tree).rbn_right_red =
               (wtree_node *)((ulong)pwVar28 & 0xfffffffffffffffe);
          if (puVar11 != (ulong *)local_9f8) {
            puVar18 = puVar13 + -4;
            if ((int)puVar13[-3] < 0) {
              *(undefined1 (*) [8])*puVar18 = auVar21;
            }
            else {
              *(ulong *)(*puVar18 + 8) =
                   (ulong)((uint)*(undefined8 *)(*puVar18 + 8) & 1) | (ulong)auVar21;
            }
            for (; auVar21 = (undefined1  [8])pwVar16, local_9f8 <= puVar18; puVar18 = puVar18 + -2)
            {
              plVar5 = (long *)*puVar18;
              *(undefined4 *)((long)plVar5 + 0x14) = 1;
              if (*plVar5 != 0) {
                *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
              }
              if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                *(int *)((long)plVar5 + 0x14U) =
                     *(int *)((long)plVar5 + 0x14U) +
                     *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
              }
            }
          }
        }
      }
      else {
        pwVar28 = (pwVar22->in_tree).rbn_right_red;
        uVar10 = (ulong)((uint)(pwVar12->in_tree).rbn_right_red & 1);
        (pwVar22->in_tree).rbn_right_red =
             (wtree_node *)((ulong)pwVar28 & 0xfffffffffffffffe | uVar10);
        (pwVar22->in_tree).rbn_left = (pwVar12->in_tree).rbn_left;
        (pwVar22->in_tree).rbn_right_red =
             (wtree_node *)((ulong)(pwVar12->in_tree).rbn_right_red & 0xfffffffffffffffe | uVar10);
        (pwVar12->in_tree).rbn_right_red =
             (wtree_node *)
             ((ulong)(pwVar12->in_tree).rbn_right_red & 0xfffffffffffffffe |
             (ulong)((uint)pwVar28 & 1));
        *puVar18 = (ulong)pwVar22;
        *puVar11 = (ulong)pwVar12;
        if (puVar18 == (ulong *)local_9f8) {
          auVar21 = (undefined1  [8])*puVar18;
        }
        else if ((int)puVar18[-1] < 0) {
          *(ulong *)puVar18[-2] = *puVar18;
        }
        else {
          *(ulong *)(puVar18[-2] + 8) =
               (ulong)((uint)*(undefined8 *)(puVar18[-2] + 8) & 1) | *puVar18;
        }
LAB_00101719:
        if ((*(byte *)(*puVar11 + 8) & 1) == 0) {
          puVar13[-2] = 0;
          if (local_9f8 <= puVar13 + -4) {
            puVar13 = puVar13 + -6;
            do {
              if ((int)puVar13[3] == 0) goto LAB_001027d2;
              pwVar28 = (wtree_node *)puVar13[4];
              if (-1 < (int)puVar13[3]) {
                puVar18 = (ulong *)puVar13[2];
                pwVar16 = (wtree_node_t *)*puVar18;
                uVar10 = (ulong)((uint)puVar18[1] & 1);
                puVar18[1] = uVar10 | (ulong)pwVar28;
                pwVar4 = (pwVar16->in_tree).rbn_right_red;
                if (((ulong)pwVar4 & 1) == 0) {
                  pwVar27 = (pwVar16->in_tree).rbn_left;
                  if (uVar10 == 0 && ((ulong)pwVar28 & 1) == 0) {
                    if ((pwVar27 == (wtree_node *)0x0) ||
                       (pwVar28 = (pwVar27->in_tree).rbn_right_red, ((ulong)pwVar28 & 1) == 0)) {
                      (pwVar16->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar4 | 1);
                      *(undefined4 *)((long)puVar18 + 0x14) = 1;
                      iVar8 = pwVar16->weight + 1;
                      *(int *)((long)puVar18 + 0x14) = iVar8;
                      if ((puVar18[1] & 0xfffffffffffffffe) != 0) {
                        *(int *)((long)puVar18 + 0x14) =
                             iVar8 + *(int *)((puVar18[1] & 0xfffffffffffffffe) + 0x14);
                      }
                      goto LAB_00101843;
                    }
                    (pwVar27->in_tree).rbn_right_red =
                         (wtree_node *)((ulong)pwVar28 & 0xfffffffffffffffe);
                    pwVar28 = (pwVar16->in_tree).rbn_right_red;
                    *puVar18 = (ulong)pwVar28 & 0xfffffffffffffffe;
                    (pwVar16->in_tree).rbn_right_red =
                         (wtree_node *)((ulong)((uint)pwVar28 & 1) | (ulong)puVar18);
                    *(undefined4 *)((long)puVar18 + 0x14) = 1;
                    if (((ulong)pwVar28 & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar18 + 0x14) =
                           *(int *)(((ulong)pwVar28 & 0xfffffffffffffffe) + 0x14) + 1;
                    }
                    if ((puVar18[1] & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar18 + 0x14) =
                           *(int *)((long)puVar18 + 0x14) +
                           *(int *)((puVar18[1] & 0xfffffffffffffffe) + 0x14);
                    }
                    pwVar28 = (pwVar16->in_tree).rbn_left;
                    pwVar16->weight = 1;
                    if (pwVar28 != (wtree_node *)0x0) {
                      pwVar16->weight = pwVar28->weight + 1;
                    }
                    if (((ulong)puVar18 & 0xfffffffffffffffe) != 0) {
                      pwVar16->weight =
                           pwVar16->weight + *(int *)(((ulong)puVar18 & 0xfffffffffffffffe) + 0x14);
                    }
                    if (puVar13 + 2 != (ulong *)local_9f8) {
                      if ((int)puVar13[1] < 0) {
                        *(wtree_node_t **)*puVar13 = pwVar16;
                        pwVar16 = (wtree_node_t *)auVar21;
                      }
                      else {
                        *(ulong *)(*puVar13 + 8) =
                             (ulong)((uint)*(undefined8 *)(*puVar13 + 8) & 1) | (ulong)pwVar16;
                        pwVar16 = (wtree_node_t *)auVar21;
                      }
                    }
                    for (; auVar21 = (undefined1  [8])pwVar16, local_9f8 <= puVar13;
                        puVar13 = puVar13 + -2) {
                      plVar5 = (long *)*puVar13;
                      *(undefined4 *)((long)plVar5 + 0x14) = 1;
                      if (*plVar5 != 0) {
                        *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
                      }
                      if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                        *(int *)((long)plVar5 + 0x14U) =
                             *(int *)((long)plVar5 + 0x14U) +
                             *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
                      }
                      pwVar16 = (wtree_node_t *)auVar21;
                    }
                  }
                  else {
                    puVar11 = puVar13 + 2;
                    if ((pwVar27 == (wtree_node *)0x0) ||
                       (((ulong)(pwVar27->in_tree).rbn_right_red & 1) == 0)) {
                      (pwVar16->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar4 | 1);
                      *(byte *)(puVar18 + 1) = (byte)puVar18[1] & 0xfe;
                      for (; local_9f8 <= puVar11; puVar11 = puVar11 + -2) {
                        plVar5 = (long *)*puVar11;
                        *(undefined4 *)((long)plVar5 + 0x14) = 1;
                        if (*plVar5 != 0) {
                          *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
                        }
                        if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                          *(int *)((long)plVar5 + 0x14U) =
                               *(int *)((long)plVar5 + 0x14U) +
                               *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
                        }
                      }
                    }
                    else {
                      puVar18[1] = (ulong)pwVar28 & 0xfffffffffffffffe;
                      ppwVar1 = &(pwVar16->in_tree).rbn_right_red;
                      *(byte *)ppwVar1 = *(byte *)ppwVar1 | 1;
                      ppwVar1 = &(pwVar27->in_tree).rbn_right_red;
                      *(byte *)ppwVar1 = *(byte *)ppwVar1 & 0xfe;
                      pwVar28 = (pwVar16->in_tree).rbn_right_red;
                      *puVar18 = (ulong)pwVar28 & 0xfffffffffffffffe;
                      (pwVar16->in_tree).rbn_right_red =
                           (wtree_node *)((ulong)((uint)pwVar28 & 1) | (ulong)puVar18);
                      *(undefined4 *)((long)puVar18 + 0x14) = 1;
                      if (((ulong)pwVar28 & 0xfffffffffffffffe) != 0) {
                        *(int *)((long)puVar18 + 0x14) =
                             *(int *)(((ulong)pwVar28 & 0xfffffffffffffffe) + 0x14) + 1;
                      }
                      if ((puVar18[1] & 0xfffffffffffffffe) != 0) {
                        *(int *)((long)puVar18 + 0x14) =
                             *(int *)((long)puVar18 + 0x14) +
                             *(int *)((puVar18[1] & 0xfffffffffffffffe) + 0x14);
                      }
                      pwVar28 = (pwVar16->in_tree).rbn_left;
                      pwVar16->weight = 1;
                      if (pwVar28 != (wtree_node *)0x0) {
                        pwVar16->weight = pwVar28->weight + 1;
                      }
                      if (((ulong)puVar18 & 0xfffffffffffffffe) != 0) {
                        pwVar16->weight =
                             pwVar16->weight +
                             *(int *)(((ulong)puVar18 & 0xfffffffffffffffe) + 0x14);
                      }
                      if (puVar11 <= local_9f8) goto LAB_00102819;
                      if ((int)puVar13[1] < 0) {
                        *(wtree_node_t **)*puVar13 = pwVar16;
                      }
                      else {
                        *(ulong *)(*puVar13 + 8) =
                             (ulong)((uint)*(undefined8 *)(*puVar13 + 8) & 1) | (ulong)pwVar16;
                      }
                      for (; local_9f8 <= puVar13; puVar13 = puVar13 + -2) {
                        plVar5 = (long *)*puVar13;
                        *(undefined4 *)((long)plVar5 + 0x14) = 1;
                        if (*plVar5 != 0) {
                          *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
                        }
                        if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                          *(int *)((long)plVar5 + 0x14U) =
                               *(int *)((long)plVar5 + 0x14U) +
                               *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
                        }
                      }
                    }
                  }
                }
                else {
                  lVar14 = *(long *)((ulong)pwVar4 & 0xfffffffffffffffe);
                  if ((lVar14 == 0) || ((*(ulong *)(lVar14 + 8) & 1) == 0)) {
                    pbVar2 = (byte *)((long *)((ulong)pwVar4 & 0xfffffffffffffffe) + 1);
                    *pbVar2 = *pbVar2 | 1;
                    pwVar28 = (pwVar16->in_tree).rbn_right_red;
                    *puVar18 = (ulong)pwVar28 & 0xfffffffffffffffe;
                    (pwVar16->in_tree).rbn_right_red =
                         (wtree_node *)((ulong)((uint)pwVar28 & 1) | (ulong)puVar18);
                    *(undefined4 *)((long)puVar18 + 0x14) = 1;
                    if (((ulong)pwVar28 & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar18 + 0x14) =
                           *(int *)(((ulong)pwVar28 & 0xfffffffffffffffe) + 0x14) + 1;
                    }
                    if ((puVar18[1] & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar18 + 0x14) =
                           *(int *)((long)puVar18 + 0x14) +
                           *(int *)((puVar18[1] & 0xfffffffffffffffe) + 0x14);
                    }
                    pwVar28 = (pwVar16->in_tree).rbn_left;
                    pwVar16->weight = 1;
                    if (pwVar28 != (wtree_node *)0x0) {
                      pwVar16->weight = pwVar28->weight + 1;
                    }
                    pwVar28 = (wtree_node *)((ulong)puVar18 & 0xfffffffffffffffe);
                    if (pwVar28 != (wtree_node *)0x0) {
                      pwVar16->weight = pwVar16->weight + pwVar28->weight;
                    }
                    (pwVar16->in_tree).rbn_right_red = pwVar28;
                    pwVar22 = pwVar16;
                  }
                  else {
                    *(ulong *)(lVar14 + 8) = *(ulong *)(lVar14 + 8) & 0xfffffffffffffffe;
                    pwVar28 = (pwVar16->in_tree).rbn_right_red;
                    pwVar22 = (wtree_node_t *)((ulong)pwVar28 & 0xfffffffffffffffe);
                    *puVar18 = (ulong)pwVar22;
                    (pwVar16->in_tree).rbn_right_red =
                         (wtree_node *)((ulong)((uint)pwVar28 & 1) | (ulong)puVar18);
                    pwVar28 = (pwVar22->in_tree).rbn_right_red;
                    *puVar18 = (ulong)pwVar28 & 0xfffffffffffffffe;
                    (pwVar22->in_tree).rbn_right_red =
                         (wtree_node *)((ulong)((uint)pwVar28 & 1) | (ulong)puVar18);
                    uVar10 = (ulong)((uint)(pwVar16->in_tree).rbn_right_red & 1);
                    (pwVar16->in_tree).rbn_right_red =
                         (wtree_node *)((long)&(pwVar22->in_tree).rbn_left + uVar10);
                    *(undefined4 *)((long)puVar18 + 0x14) = 1;
                    if (((ulong)pwVar28 & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar18 + 0x14) =
                           *(int *)(((ulong)pwVar28 & 0xfffffffffffffffe) + 0x14) + 1;
                    }
                    if ((puVar18[1] & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar18 + 0x14) =
                           *(int *)((long)puVar18 + 0x14) +
                           *(int *)((puVar18[1] & 0xfffffffffffffffe) + 0x14);
                    }
                    pwVar28 = (pwVar22->in_tree).rbn_left;
                    pwVar4 = (pwVar22->in_tree).rbn_right_red;
                    pwVar22->weight = 1;
                    if (pwVar28 != (wtree_node *)0x0) {
                      pwVar22->weight = pwVar28->weight + 1;
                    }
                    uVar23 = (ulong)pwVar4 & 0xfffffffffffffffe;
                    if (uVar23 != 0) {
                      pwVar22->weight = pwVar22->weight + *(int *)(uVar23 + 0x14);
                    }
                    (pwVar16->in_tree).rbn_right_red = (wtree_node *)(uVar10 | (ulong)pwVar28);
                    (pwVar22->in_tree).rbn_left = pwVar16;
                    pwVar4 = (pwVar16->in_tree).rbn_left;
                    pwVar16->weight = 1;
                    if (pwVar4 != (wtree_node *)0x0) {
                      pwVar16->weight = pwVar4->weight + 1;
                    }
                    if (((ulong)pwVar28 & 0xfffffffffffffffe) != 0) {
                      pwVar16->weight =
                           pwVar16->weight + *(int *)(((ulong)pwVar28 & 0xfffffffffffffffe) + 0x14);
                    }
                    pwVar28 = (pwVar22->in_tree).rbn_right_red;
                    pwVar22->weight = 1;
                    iVar8 = pwVar16->weight + 1;
                    pwVar22->weight = iVar8;
                    uVar10 = (ulong)pwVar28 & 0xfffffffffffffffe;
                    if (uVar10 != 0) {
                      pwVar22->weight = iVar8 + *(int *)(uVar10 + 0x14);
                    }
                  }
                  if (puVar13 + 2 != (ulong *)local_9f8) {
                    if ((int)puVar13[1] < 0) {
                      *(wtree_node_t **)*puVar13 = pwVar22;
                      pwVar22 = (wtree_node_t *)auVar21;
                    }
                    else {
                      *(ulong *)(*puVar13 + 8) =
                           (ulong)((uint)*(undefined8 *)(*puVar13 + 8) & 1) | (ulong)pwVar22;
                      pwVar22 = (wtree_node_t *)auVar21;
                    }
                  }
                  for (; auVar21 = (undefined1  [8])pwVar22, local_9f8 <= puVar13;
                      puVar13 = puVar13 + -2) {
                    plVar5 = (long *)*puVar13;
                    *(undefined4 *)((long)plVar5 + 0x14) = 1;
                    if (*plVar5 != 0) {
                      *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
                    }
                    if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                      *(int *)((long)plVar5 + 0x14U) =
                           *(int *)((long)plVar5 + 0x14U) +
                           *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
                    }
                    pwVar22 = (wtree_node_t *)auVar21;
                  }
                }
                goto LAB_001018f5;
              }
              pwVar4 = (wtree_node *)puVar13[2];
              (pwVar4->in_tree).rbn_left = pwVar28;
              pwVar28 = (pwVar4->in_tree).rbn_right_red;
              if (((ulong)pwVar28 & 1) != 0) {
                pwVar28 = (wtree_node *)((ulong)pwVar28 & 0xfffffffffffffffe);
                pwVar27 = (pwVar28->in_tree).rbn_left;
                if ((pwVar27 == (wtree_node *)0x0) ||
                   (((ulong)(pwVar27->in_tree).rbn_right_red & 1) == 0)) {
                  (pwVar4->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar27 | 1);
                  (pwVar28->in_tree).rbn_left = pwVar4;
                  pwVar26 = (pwVar4->in_tree).rbn_left;
                  pwVar4->weight = 1;
                  if (pwVar26 != (wtree_node *)0x0) {
                    pwVar4->weight = pwVar26->weight + 1;
                  }
                  if (((ulong)pwVar27 & 0xfffffffffffffffe) != 0) {
                    pwVar4->weight =
                         pwVar4->weight + *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14);
                  }
                  pwVar27 = (pwVar28->in_tree).rbn_right_red;
                  pwVar28->weight = 1;
                  iVar8 = pwVar4->weight + 1;
                  pwVar28->weight = iVar8;
                }
                else {
                  (pwVar4->in_tree).rbn_right_red = pwVar28;
                  pwVar26 = (pwVar27->in_tree).rbn_right_red;
                  (pwVar28->in_tree).rbn_left = (wtree_node *)((ulong)pwVar26 & 0xfffffffffffffffe);
                  (pwVar27->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar26 & 1) | (ulong)pwVar28);
                  pwVar6 = (pwVar28->in_tree).rbn_right_red;
                  pwVar28->weight = 1;
                  if (((ulong)pwVar26 & 0xfffffffffffffffe) != 0) {
                    pwVar28->weight = *(int *)(((ulong)pwVar26 & 0xfffffffffffffffe) + 0x14) + 1;
                  }
                  uVar10 = (ulong)pwVar6 & 0xfffffffffffffffe;
                  if (uVar10 != 0) {
                    pwVar28->weight = pwVar28->weight + *(int *)(uVar10 + 0x14);
                  }
                  pwVar26 = (pwVar27->in_tree).rbn_left;
                  pwVar27->weight = 1;
                  if (pwVar26 != (wtree_node *)0x0) {
                    pwVar27->weight = pwVar26->weight + 1;
                  }
                  pwVar27->weight = pwVar27->weight + pwVar28->weight;
                  pwVar26 = (wtree_node *)
                            ((ulong)((uint)(pwVar4->in_tree).rbn_right_red & 1) | (ulong)pwVar27);
                  (pwVar4->in_tree).rbn_right_red = pwVar26;
                  pwVar28 = (wtree_node *)((ulong)pwVar27 & 0xfffffffffffffffe);
                  pwVar27 = (pwVar28->in_tree).rbn_left;
                  (pwVar4->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar26 & 1) | (ulong)pwVar27);
                  (pwVar28->in_tree).rbn_left = pwVar4;
                  pwVar26 = (pwVar4->in_tree).rbn_left;
                  pwVar4->weight = 1;
                  if (pwVar26 != (wtree_node *)0x0) {
                    pwVar4->weight = pwVar26->weight + 1;
                  }
                  uVar10 = (ulong)pwVar27 & 0xfffffffffffffffe;
                  if (uVar10 != 0) {
                    pwVar4->weight = pwVar4->weight + *(int *)(uVar10 + 0x14);
                  }
                  pwVar27 = (pwVar28->in_tree).rbn_right_red;
                  pwVar28->weight = 1;
                  iVar8 = pwVar4->weight + 1;
                  pwVar28->weight = iVar8;
                }
                if (((ulong)pwVar27 & 0xfffffffffffffffe) != 0) {
                  pwVar28->weight = iVar8 + *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14);
                }
                if (local_9f8 < puVar13 + 2) {
                  if ((int)puVar13[1] < 0) {
                    *(wtree_node **)*puVar13 = pwVar28;
                  }
                  else {
                    *(ulong *)(*puVar13 + 8) =
                         (ulong)((uint)*(undefined8 *)(*puVar13 + 8) & 1) | (ulong)pwVar28;
                  }
                  for (; local_9f8 <= puVar13; puVar13 = puVar13 + -2) {
                    plVar5 = (long *)*puVar13;
                    *(undefined4 *)((long)plVar5 + 0x14) = 1;
                    if (*plVar5 != 0) {
                      *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
                    }
                    if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                      *(int *)((long)plVar5 + 0x14U) =
                           *(int *)((long)plVar5 + 0x14U) +
                           *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
                    }
                  }
                  goto LAB_001018f5;
                }
LAB_00102819:
                __assertion = "(uintptr_t)pathp > (uintptr_t)path";
                goto LAB_00102806;
              }
              pwVar27 = (pwVar28->in_tree).rbn_left;
              if ((pwVar27 != (wtree_node *)0x0) &&
                 (pwVar26 = (pwVar27->in_tree).rbn_right_red, ((ulong)pwVar26 & 1) != 0)) {
                (pwVar27->in_tree).rbn_right_red =
                     (wtree_node *)((ulong)pwVar26 & 0xfffffffffffffffe);
                (pwVar28->in_tree).rbn_left = (wtree_node *)((ulong)pwVar26 & 0xfffffffffffffffe);
                (pwVar27->in_tree).rbn_right_red = pwVar28;
                pwVar6 = (pwVar28->in_tree).rbn_right_red;
                pwVar28->weight = 1;
                if (((ulong)pwVar26 & 0xfffffffffffffffe) != 0) {
                  pwVar28->weight = *(int *)(((ulong)pwVar26 & 0xfffffffffffffffe) + 0x14) + 1;
                }
                uVar10 = (ulong)pwVar6 & 0xfffffffffffffffe;
                if (uVar10 != 0) {
                  pwVar28->weight = pwVar28->weight + *(int *)(uVar10 + 0x14);
                }
                pwVar26 = (pwVar27->in_tree).rbn_left;
                pwVar27->weight = 1;
                if (pwVar26 != (wtree_node *)0x0) {
                  pwVar27->weight = pwVar26->weight + 1;
                }
                pwVar27->weight = pwVar27->weight + pwVar28->weight;
                pwVar26 = (wtree_node *)
                          ((ulong)((uint)(pwVar4->in_tree).rbn_right_red & 1) | (ulong)pwVar27);
                (pwVar4->in_tree).rbn_right_red = pwVar26;
                pwVar16 = (wtree_node_t *)((ulong)pwVar27 & 0xfffffffffffffffe);
                pwVar28 = (pwVar16->in_tree).rbn_left;
                (pwVar4->in_tree).rbn_right_red =
                     (wtree_node *)((ulong)((uint)pwVar26 & 1) | (ulong)pwVar28);
                (pwVar16->in_tree).rbn_left = pwVar4;
                pwVar27 = (pwVar4->in_tree).rbn_left;
                pwVar4->weight = 1;
                if (pwVar27 != (wtree_node *)0x0) {
                  pwVar4->weight = pwVar27->weight + 1;
                }
                uVar10 = (ulong)pwVar28 & 0xfffffffffffffffe;
                if (uVar10 != 0) {
                  pwVar4->weight = pwVar4->weight + *(int *)(uVar10 + 0x14);
                }
                pwVar28 = (pwVar16->in_tree).rbn_right_red;
                pwVar16->weight = 1;
                iVar8 = pwVar4->weight + 1;
                pwVar16->weight = iVar8;
                uVar10 = (ulong)pwVar28 & 0xfffffffffffffffe;
                if (uVar10 != 0) {
                  pwVar16->weight = iVar8 + *(int *)(uVar10 + 0x14);
                }
                if (puVar13 + 2 != (ulong *)local_9f8) {
                  puVar25 = (undefined8 *)*puVar13;
                  if ((int)puVar13[1] < 0) {
                    *puVar25 = pwVar16;
                    pwVar16 = (wtree_node_t *)auVar21;
                  }
                  else {
                    puVar25[1] = (ulong)((uint)puVar25[1] & 1) | (ulong)pwVar16;
                    pwVar16 = (wtree_node_t *)auVar21;
                  }
                }
                for (; auVar21 = (undefined1  [8])pwVar16, local_9f8 <= puVar13;
                    puVar13 = puVar13 + -2) {
                  plVar5 = (long *)*puVar13;
                  *(undefined4 *)((long)plVar5 + 0x14) = 1;
                  if (*plVar5 != 0) {
                    *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
                  }
                  if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
                    *(int *)((long)plVar5 + 0x14U) =
                         *(int *)((long)plVar5 + 0x14U) +
                         *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
                  }
                  pwVar16 = (wtree_node_t *)auVar21;
                }
                goto LAB_001018f5;
              }
              (pwVar4->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar27 | 1);
              (pwVar28->in_tree).rbn_left = pwVar4;
              pwVar26 = (pwVar4->in_tree).rbn_left;
              pwVar4->weight = 1;
              if (pwVar26 != (wtree_node *)0x0) {
                pwVar4->weight = pwVar26->weight + 1;
              }
              if (((ulong)pwVar27 & 0xfffffffffffffffe) != 0) {
                pwVar4->weight =
                     pwVar4->weight + *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14);
              }
              pwVar27 = (pwVar28->in_tree).rbn_right_red;
              pwVar28->weight = 1;
              iVar8 = pwVar4->weight + 1;
              pwVar28->weight = iVar8;
              uVar10 = (ulong)pwVar27 & 0xfffffffffffffffe;
              if (uVar10 != 0) {
                pwVar28->weight = iVar8 + *(int *)(uVar10 + 0x14);
              }
              puVar13[2] = (ulong)pwVar28;
LAB_00101843:
              bVar32 = local_9f8 <= puVar13;
              puVar13 = puVar13 + -2;
            } while (bVar32);
          }
          auVar21 = local_9f8;
          if (((ulong)((anon_struct_16_2_6fa94910_for_in_tree *)local_9f8)->rbn_right_red & 1) != 0)
          {
            __assertion = "rbtn_red_get(wtree_node_t, in_tree, rbtree->rbt_root) == false";
            goto LAB_00102806;
          }
        }
        else {
          if (-1 < (int)puVar13[-3]) {
            __assertion = "pathp[-1].cmp < 0";
            goto LAB_00102806;
          }
          *(undefined8 *)puVar13[-4] = 0;
          for (puVar13 = puVar13 + -4; local_9f8 <= puVar13; puVar13 = puVar13 + -2) {
            plVar5 = (long *)*puVar13;
            *(undefined4 *)((long)plVar5 + 0x14) = 1;
            if (*plVar5 != 0) {
              *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
            }
            if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
              *(int *)((long)plVar5 + 0x14U) =
                   *(int *)((long)plVar5 + 0x14U) +
                   *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
            }
          }
        }
      }
LAB_001018f5:
      free(pwVar12);
      pwVar16 = (wtree_node_t *)auVar21;
    }
    pwVar12 = (wtree_node_t *)malloc(0x18);
    *(wtree_node_t **)((long)local_40 + (long)(int)pwVar15 * 8) = pwVar12;
    left = pwVar15;
    iVar8 = rand();
    iVar19 = iVar8 % 3000 + 1;
    pwVar12->value = iVar19;
    (pwVar12->in_tree).rbn_left = (wtree_node *)0x0;
    (pwVar12->in_tree).rbn_right_red = (wtree_node *)0x1;
    pwVar12->weight = 1;
    local_9f8 = (undefined1  [8])pwVar16;
    puVar13 = (ulong *)local_9f8;
    if (pwVar16 != (wtree_node_t *)0x0) {
      pwVar28 = pwVar16;
      do {
        iVar9 = pwVar28->value;
        uVar17 = (uint)(iVar9 <= iVar8 % 3000);
        if (iVar19 < iVar9) {
          uVar17 = 0xffffffff;
        }
        uVar30 = (uint)(pwVar28 < pwVar12);
        if (pwVar12 < pwVar28) {
          uVar30 = 0xffffffff;
        }
        if (uVar17 != 0) {
          uVar30 = uVar17;
        }
        *(uint *)(puVar13 + 1) = uVar30;
        if (uVar30 == 0) {
          __assertion = "cmp != 0";
          __function = "void wtree_insert(wtree_t *, wtree_node_t *)";
          goto LAB_0010276e;
        }
        bVar32 = iVar19 < iVar9;
        if (uVar17 == 0) {
          bVar32 = pwVar12 < pwVar28;
        }
        if (bVar32) {
          pwVar28 = (pwVar28->in_tree).rbn_left;
        }
        else {
          pwVar28 = (wtree_node *)((ulong)(pwVar28->in_tree).rbn_right_red & 0xfffffffffffffffe);
        }
        puVar13[2] = (ulong)pwVar28;
        puVar13 = puVar13 + 2;
      } while (pwVar28 != (wtree_node *)0x0);
    }
    *puVar13 = (ulong)pwVar12;
    pwVar15 = left;
    iVar8 = (int)local_38;
    while (puVar18 = puVar13 + -2, local_9f8 <= puVar18) {
      puVar11 = (ulong *)puVar13[-2];
      puVar20 = (ulong *)*puVar13;
      if ((int)puVar13[-1] < 0) {
        *puVar11 = (ulong)puVar20;
        uVar10 = puVar20[1];
        puVar13 = puVar18;
        if ((uVar10 & 1) == 0) {
          do {
            plVar5 = (long *)*puVar13;
            *(undefined4 *)((long)plVar5 + 0x14) = 1;
            if (*plVar5 != 0) {
              *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
            }
            if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
              *(int *)((long)plVar5 + 0x14U) =
                   *(int *)((long)plVar5 + 0x14U) +
                   *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
            }
            puVar13 = puVar13 + -2;
          } while (local_9f8 <= puVar13);
        }
        else {
          uVar23 = *puVar20;
          if ((uVar23 == 0) || ((*(ulong *)(uVar23 + 8) & 1) == 0)) {
            *(undefined4 *)((long)puVar11 + 0x14) = 1;
            iVar19 = *(int *)((long)puVar20 + 0x14) + 1;
            *(int *)((long)puVar11 + 0x14) = iVar19;
            if ((puVar11[1] & 0xfffffffffffffffe) != 0) {
              piVar24 = (int *)((puVar11[1] & 0xfffffffffffffffe) + 0x14);
              puVar20 = puVar11;
              goto LAB_00101c75;
            }
          }
          else {
            *(ulong *)(uVar23 + 8) = *(ulong *)(uVar23 + 8) & 0xfffffffffffffffe;
            uVar23 = puVar20[1];
            *puVar11 = uVar23 & 0xfffffffffffffffe;
            puVar20[1] = (ulong)((uint)uVar23 & 1) | (ulong)puVar11;
            *(undefined4 *)((long)puVar11 + 0x14) = 1;
            if ((uVar23 & 0xfffffffffffffffe) != 0) {
              *(int *)((long)puVar11 + 0x14) = *(int *)((uVar23 & 0xfffffffffffffffe) + 0x14) + 1;
            }
            if ((puVar11[1] & 0xfffffffffffffffe) != 0) {
              *(int *)((long)puVar11 + 0x14) =
                   *(int *)((long)puVar11 + 0x14) +
                   *(int *)((puVar11[1] & 0xfffffffffffffffe) + 0x14);
            }
            piVar24 = (int *)((long)puVar20 + 0x14);
            *(undefined4 *)((long)puVar20 + 0x14) = 1;
            if (*puVar20 != 0) {
              *piVar24 = *(int *)(*puVar20 + 0x14) + 1;
            }
            uVar23 = (ulong)puVar11 & 0xfffffffffffffffe;
            puVar11 = puVar20;
            if (uVar23 != 0) {
              iVar19 = *(int *)(uVar23 + 0x14);
LAB_00101c75:
              *(int *)((long)puVar20 + 0x14) = iVar19 + *piVar24;
              puVar11 = puVar20;
            }
          }
        }
      }
      else {
        uVar23 = (ulong)((uint)puVar11[1] & 1) | (ulong)puVar20;
        puVar11[1] = uVar23;
        uVar10 = puVar20[1];
        puVar13 = puVar18;
        if ((uVar10 & 1) == 0) {
          do {
            plVar5 = (long *)*puVar13;
            *(undefined4 *)((long)plVar5 + 0x14) = 1;
            if (*plVar5 != 0) {
              *(int *)((long)plVar5 + 0x14) = *(int *)(*plVar5 + 0x14) + 1;
            }
            if ((plVar5[1] & 0xfffffffffffffffeU) != 0) {
              *(int *)((long)plVar5 + 0x14U) =
                   *(int *)((long)plVar5 + 0x14U) +
                   *(int *)((plVar5[1] & 0xfffffffffffffffeU) + 0x14);
            }
            puVar13 = puVar13 + -2;
          } while (local_9f8 <= puVar13);
        }
        else {
          lVar14 = *puVar11;
          if ((lVar14 == 0) || ((*(ulong *)(lVar14 + 8) & 1) == 0)) {
            uVar23 = (ulong)((uint)uVar23 & 1);
            puVar20 = (ulong *)((ulong)puVar20 & 0xfffffffffffffffe);
            puVar11[1] = *puVar20 | uVar23;
            *puVar20 = (ulong)puVar11;
            puVar20[1] = puVar20[1] & 0xfffffffffffffffe | uVar23;
            uVar23 = puVar11[1];
            puVar11[1] = uVar23 | 1;
            *(undefined4 *)((long)puVar11 + 0x14) = 1;
            if (*puVar11 != 0) {
              *(int *)((long)puVar11 + 0x14) = *(int *)(*puVar11 + 0x14) + 1;
            }
            uVar23 = uVar23 & 0xfffffffffffffffe;
            if (uVar23 != 0) {
              *(int *)((long)puVar11 + 0x14) =
                   *(int *)((long)puVar11 + 0x14) + *(int *)(uVar23 + 0x14);
            }
            uVar23 = puVar20[1];
            *(undefined4 *)((long)puVar20 + 0x14) = 1;
            iVar19 = *(int *)((long)puVar11 + 0x14) + 1;
            *(int *)((long)puVar20 + 0x14) = iVar19;
            puVar11 = puVar20;
          }
          else {
            *(ulong *)(lVar14 + 8) = *(ulong *)(lVar14 + 8) & 0xfffffffffffffffe;
            *(byte *)(puVar20 + 1) = (byte)puVar20[1] & 0xfe;
            uVar23 = puVar11[1];
            puVar11[1] = uVar23 | 1;
            *(undefined4 *)((long)puVar11 + 0x14) = 1;
            iVar19 = *(int *)(lVar14 + 0x14) + 1;
            *(int *)((long)puVar11 + 0x14) = iVar19;
          }
          if ((uVar23 & 0xfffffffffffffffe) != 0) {
            *(int *)((long)puVar11 + 0x14) = iVar19 + *(int *)((uVar23 & 0xfffffffffffffffe) + 0x14)
            ;
          }
        }
      }
      if ((uVar10 & 1) == 0) goto LAB_00101a08;
      *puVar18 = (ulong)puVar11;
      puVar13 = puVar18;
    }
    ppwVar1 = &(((wtree_node_t *)local_9f8)->in_tree).rbn_right_red;
    *ppwVar1 = (wtree_node *)((ulong)*ppwVar1 & 0xfffffffffffffffe);
    pwVar16 = (wtree_node_t *)local_9f8;
LAB_00101a08:
    pwVar15 = (wtree_node_t *)(ulong)((int)pwVar15 + 1);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3000);
  local_70 = 0;
  if (pwVar16 != (wtree_node_t *)0x0) {
    lVar14 = 0;
    pwVar28 = pwVar16;
    do {
      (&local_1f0)[lVar14] = pwVar28;
      pwVar28 = (pwVar28->in_tree).rbn_left;
      if (pwVar28 == (wtree_node *)0x0) {
        local_70 = (int)lVar14 + 1;
        goto LAB_001023bf;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x30);
    local_70 = 0x30;
    __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
    __function = "void wtree_ifirst(wtree_t *, struct wtree_iterator *)";
LAB_0010276e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c"
                  ,0x40,__function);
  }
LAB_001023bf:
  uVar10 = (ulong)local_70;
  pwVar12 = (wtree_node_t *)0x0;
  do {
    pwVar22 = pwVar12;
    uVar17 = (uint)uVar10;
    if (uVar17 == 0) {
      pwVar12 = (wtree_node_t *)0x0;
    }
    else {
      pwVar12 = (&local_1f0)[uVar17 - 1];
      pwVar28 = (wtree_node *)((ulong)(pwVar12->in_tree).rbn_right_red & 0xfffffffffffffffe);
      if (pwVar28 == (wtree_node_t *)0x0) {
        uVar23 = uVar10 + 0xfffffffe;
        uVar29 = uVar10;
        do {
          uVar29 = uVar29 - 1;
          if ((int)uVar29 == 0) {
            uVar10 = 0;
            break;
          }
          uVar31 = uVar23 & 0xffffffff;
          uVar23 = uVar23 - 1;
          uVar10 = (ulong)((int)uVar10 - 1);
        } while ((&local_1f0)[uVar29 & 0xffffffff] ==
                 (wtree_node_t *)
                 ((ulong)((&local_1f0)[uVar31]->in_tree).rbn_right_red & 0xfffffffffffffffe));
      }
      else {
        uVar23 = 0x30;
        if (0x30 < uVar17) {
          uVar23 = uVar10;
        }
        if (0x2f < uVar17) {
LAB_001027b3:
          __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
          __function = "wtree_node_t *wtree_inext(struct wtree_iterator *)";
          local_70 = uVar17;
          goto LAB_0010276e;
        }
        while( true ) {
          (&local_1f0)[uVar10] = pwVar28;
          pwVar28 = (pwVar28->in_tree).rbn_left;
          if (pwVar28 == (wtree_node *)0x0) break;
          uVar10 = uVar10 + 1;
          if (uVar23 == uVar10) {
            uVar17 = (uint)uVar23;
            goto LAB_001027b3;
          }
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      }
    }
    uVar17 = (uint)uVar10;
    if (pwVar12 == (wtree_node_t *)0x0) goto LAB_0010247f;
  } while ((pwVar22 == (wtree_node_t *)0x0) || (pwVar22->value <= pwVar12->value));
  main_cold_1();
LAB_0010247f:
  walk.path[0x2f].dir = 0;
  local_9f8 = (undefined1  [8])pwVar16;
  local_70 = uVar17;
  right = pwVar15;
  do {
    pwVar15 = wtree_walk_next((wtree_walk *)local_9f8,3,&local_58,&local_68);
    if (pwVar15 == (wtree_node_t *)0x0) goto LAB_001024ec;
    if (local_58 == (wtree_node_t *)0x0) {
      iVar8 = 1;
    }
    else {
      iVar8 = local_58->weight + 1;
    }
    if (local_68 == (wtree_node_t *)0x0) {
      iVar19 = 0;
    }
    else {
      iVar19 = local_68->weight;
    }
  } while (pwVar15->weight == iVar19 + iVar8);
  main_cold_2();
LAB_001024ec:
  iVar8 = 0;
  local_38 = pwVar16;
  do {
    local_44 = iVar8;
    iVar8 = rand();
    iVar19 = iVar8 % 0x1194 + -0x2ee;
    walk.path[0x2f].dir = 0;
    local_9f8 = (undefined1  [8])local_38;
    pwVar16 = wtree_walk_next((wtree_walk *)local_9f8,0,&local_1f0,&local_58);
    iVar8 = 0;
    if (pwVar16 != (wtree_node_t *)0x0) {
      iVar8 = 0;
      do {
        iVar9 = 1;
        if (pwVar16->value < iVar19) {
          if (local_1f0 != (wtree_node_t *)0x0) {
            iVar8 = iVar8 + local_1f0->weight;
          }
          iVar8 = iVar8 + 1;
          iVar9 = 2;
        }
        pwVar16 = wtree_walk_next((wtree_walk *)local_9f8,iVar9,&local_1f0,&local_58);
      } while (pwVar16 != (wtree_node_t *)0x0);
    }
    iVar9 = 0;
    uVar10 = 0;
    if (local_38 != (wtree_node_t *)0x0) {
      uVar10 = 0;
      pwVar28 = local_38;
      uVar23 = 0;
      while( true ) {
        uVar29 = uVar23 + 1;
        iVar3 = pwVar28->value;
        *(wtree_node **)((long)walk.path + uVar23 * 8 + -8) = pwVar28;
        if ((iVar19 < iVar3) || (iVar19 <= iVar3)) {
          pwVar28 = (pwVar28->in_tree).rbn_left;
        }
        else {
          pwVar28 = (wtree_node *)((ulong)(pwVar28->in_tree).rbn_right_red & 0xfffffffffffffffe);
          uVar10 = uVar29 & 0xffffffff;
        }
        if (pwVar28 == (wtree_node *)0x0) break;
        uVar23 = uVar29;
        if (uVar29 == 0x30) {
          walk.path[0x17].dir = 0x30;
          __assertion = "it->count < RB_MAX_TREE_HEIGHT";
          __function = "void wtree_isearch_lt(wtree_t *, int, struct wtree_iterator *)";
          goto LAB_0010276e;
        }
      }
    }
    walk.path[0x17].dir = (int)uVar10;
    bVar32 = (int)uVar10 == 0;
    if (!bVar32) {
      iVar9 = 0;
      do {
        uVar17 = (uint)uVar10;
        uVar23 = **(ulong **)((long)walk.path + (ulong)(uVar17 - 1) * 8 + -8);
        uVar29 = (ulong)(uVar17 - 1);
        if (uVar23 == 0) {
          do {
            if ((int)uVar29 == 0) {
              uVar10 = 0;
              goto LAB_00102676;
            }
            uVar17 = (int)uVar29 - 1;
            uVar10 = (ulong)uVar17;
            lVar14 = uVar29 * 8;
            uVar29 = (ulong)uVar17;
          } while (**(long **)((long)walk.path + uVar10 * 8 + -8) ==
                   *(long *)((long)walk.path + lVar14 + -8));
        }
        else {
          uVar29 = 0x30;
          if (0x30 < uVar17) {
            uVar29 = uVar10;
          }
          if (0x2f < uVar17) {
LAB_00102753:
            __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
            __function = "wtree_node_t *wtree_iprev(struct wtree_iterator *)";
            walk.path[0x17].dir = uVar17;
            goto LAB_0010276e;
          }
          while( true ) {
            *(ulong *)((long)walk.path + uVar10 * 8 + -8) = uVar23;
            uVar23 = *(ulong *)(uVar23 + 8) & 0xfffffffffffffffe;
            if (uVar23 == 0) break;
            uVar10 = uVar10 + 1;
            if (uVar29 == uVar10) {
              uVar17 = (uint)uVar29;
              goto LAB_00102753;
            }
          }
        }
        uVar10 = (ulong)((int)uVar10 + 1);
LAB_00102676:
        if (bVar32) break;
        iVar9 = iVar9 + 1;
        bVar32 = (int)uVar10 == 0;
      } while (!bVar32);
    }
    if (iVar8 != iVar9) {
      main_cold_3();
LAB_001027d2:
      __assertion = "pathp->cmp != 0";
LAB_00102806:
      __function = "void wtree_remove(wtree_t *, wtree_node_t *)";
      goto LAB_0010276e;
    }
    iVar8 = local_44 + 1;
    if (iVar8 == 100) {
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c",0xb5,
          "line %d",0xb5);
      __ptr = local_40;
      if (-1 < (int)left) {
        uVar10 = (ulong)right & 0xffffffff;
        uVar23 = 0;
        do {
          free(*(void **)((long)__ptr + uVar23 * 8));
          uVar23 = uVar23 + 1;
        } while (uVar10 != uVar23);
      }
      free(__ptr);
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","check_aug");
      check_plan();
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","main");
      iVar8 = check_plan();
      return iVar8;
    }
  } while( true );
}

Assistant:

int main()
{
	plan(1);
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	check_aug();

	footer();
	return check_plan();
}